

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Material.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::ParseNode_TexMap(AMFImporter *this,bool pUseOldName)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  CAMFImporter_NodeElement_TexMap *this_00;
  ulong uVar5;
  DeadlyImportError *pDVar6;
  float fVar7;
  allocator local_7c9;
  string local_7c8;
  allocator local_7a1;
  string local_7a0;
  allocator local_779;
  string local_778;
  allocator local_751;
  string local_750;
  allocator local_729;
  string local_728;
  allocator local_701;
  string local_700;
  allocator local_6d9;
  string local_6d8;
  allocator local_6b1;
  string local_6b0;
  allocator local_689;
  string local_688;
  allocator local_661;
  string local_660;
  allocator local_639;
  string local_638;
  allocator local_611;
  string local_610;
  allocator local_5e9;
  string local_5e8;
  allocator local_5c1;
  string local_5c0;
  allocator local_599;
  string local_598;
  allocator local_571;
  string local_570;
  allocator local_549;
  string local_548;
  allocator local_521;
  string local_520;
  allocator local_4f9;
  string local_4f8;
  allocator local_4d1;
  string local_4d0;
  allocator local_4a9;
  string local_4a8;
  allocator local_481;
  string local_480;
  byte local_45a;
  allocator local_459;
  undefined1 local_458 [6];
  bool close_found_1;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  allocator local_341;
  string local_340;
  allocator local_319;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  allocator local_229;
  string local_228;
  allocator local_201;
  string local_200;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  byte local_111;
  undefined4 local_110;
  undefined2 local_10c;
  undefined1 local_10a;
  bool close_found;
  bool read_flag [6];
  CAMFImporter_NodeElement_TexMap *als;
  CAMFImporter_NodeElement *ne;
  undefined1 local_d0 [8];
  string an;
  uint local_9c;
  int idx_end;
  int idx;
  string atexid;
  string btexid;
  string gtexid;
  string rtexid;
  bool pUseOldName_local;
  AMFImporter *this_local;
  
  std::__cxx11::string::string((string *)(gtexid.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(btexid.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(atexid.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&idx_end);
  local_9c = 0;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  for (; (int)local_9c < iVar2; local_9c = local_9c + 1) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,(ulong)local_9c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_d0,(char *)CONCAT44(extraout_var,iVar3),(allocator *)((long)&ne + 7))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&ne + 7));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d0,"rtexid");
    if (bVar1) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_9c);
      std::__cxx11::string::operator=
                ((string *)(gtexid.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar3)
                );
      ne._0_4_ = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d0,"gtexid");
      if (bVar1) {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_9c);
        std::__cxx11::string::operator=
                  ((string *)(btexid.field_2._M_local_buf + 8),
                   (char *)CONCAT44(extraout_var_01,iVar3));
        ne._0_4_ = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0,"btexid");
        if (bVar1) {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_9c);
          std::__cxx11::string::operator=
                    ((string *)(atexid.field_2._M_local_buf + 8),
                     (char *)CONCAT44(extraout_var_02,iVar3));
          ne._0_4_ = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0,"atexid");
          if (bVar1) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_9c);
            std::__cxx11::string::operator=
                      ((string *)&idx_end,(char *)CONCAT44(extraout_var_03,iVar3));
            ne._0_4_ = 4;
          }
          else {
            Throw_IncorrectAttr(this,(string *)local_d0);
            ne._0_4_ = 0;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_d0);
  }
  this_00 = (CAMFImporter_NodeElement_TexMap *)operator_new(0xf8);
  CAMFImporter_NodeElement_TexMap::CAMFImporter_NodeElement_TexMap(this_00,this->mNodeElement_Cur);
  als = this_00;
  uVar5 = std::__cxx11::string::empty();
  if ((((uVar5 & 1) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0)) &&
     (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0)) {
    local_10a = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)read_flag,"ParseNode_TexMap. At least one texture ID must be defined.",
               (allocator *)&close_found);
    DeadlyImportError::DeadlyImportError(pDVar6,(string *)read_flag);
    local_10a = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  XML_CheckNode_MustHaveChildren(this);
  local_10c = 0;
  local_110 = 0;
  ParseHelper_Node_Enter(this,&als->super_CAMFImporter_NodeElement);
  if (pUseOldName) {
    local_45a = 0;
    do {
      do {
        while( true ) {
          uVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar4 & 1) == 0) goto LAB_005812fc;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_480,"u1",&local_481);
          bVar1 = XML_CheckNode_NameEqual(this,&local_480);
          std::__cxx11::string::~string((string *)&local_480);
          std::allocator<char>::~allocator((allocator<char> *)&local_481);
          if (bVar1) {
            if ((local_110 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_4a8,"u1",&local_4a9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_4d0,"Only one component can be defined.",&local_4d1);
              Throw_MoreThanOnceDefined(this,&local_4a8,&local_4d0);
              std::__cxx11::string::~string((string *)&local_4d0);
              std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
              std::__cxx11::string::~string((string *)&local_4a8);
              std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
            }
            fVar7 = XML_ReadNode_GetVal_AsFloat(this);
            this_00->TextureCoordinate[0].x = fVar7;
            local_110 = CONCAT31(local_110._1_3_,1);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4f8,"u2",&local_4f9);
            bVar1 = XML_CheckNode_NameEqual(this,&local_4f8);
            std::__cxx11::string::~string((string *)&local_4f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
            if (bVar1) {
              if ((local_110 & 0x100) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_520,"u2",&local_521);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_548,"Only one component can be defined.",&local_549);
                Throw_MoreThanOnceDefined(this,&local_520,&local_548);
                std::__cxx11::string::~string((string *)&local_548);
                std::allocator<char>::~allocator((allocator<char> *)&local_549);
                std::__cxx11::string::~string((string *)&local_520);
                std::allocator<char>::~allocator((allocator<char> *)&local_521);
              }
              fVar7 = XML_ReadNode_GetVal_AsFloat(this);
              this_00->TextureCoordinate[1].x = fVar7;
              local_110._0_2_ = CONCAT11(1,(undefined1)local_110);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_570,"u3",&local_571);
              bVar1 = XML_CheckNode_NameEqual(this,&local_570);
              std::__cxx11::string::~string((string *)&local_570);
              std::allocator<char>::~allocator((allocator<char> *)&local_571);
              if (bVar1) {
                if ((local_110 & 0x10000) != 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_598,"u3",&local_599);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_5c0,"Only one component can be defined.",&local_5c1);
                  Throw_MoreThanOnceDefined(this,&local_598,&local_5c0);
                  std::__cxx11::string::~string((string *)&local_5c0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
                  std::__cxx11::string::~string((string *)&local_598);
                  std::allocator<char>::~allocator((allocator<char> *)&local_599);
                }
                fVar7 = XML_ReadNode_GetVal_AsFloat(this);
                this_00->TextureCoordinate[2].x = fVar7;
                local_110._0_3_ = CONCAT12(1,(undefined2)local_110);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_5e8,"v1",&local_5e9);
                bVar1 = XML_CheckNode_NameEqual(this,&local_5e8);
                std::__cxx11::string::~string((string *)&local_5e8);
                std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
                if (bVar1) {
                  if ((local_110 & 0x1000000) != 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_610,"v1",&local_611);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_638,"Only one component can be defined.",&local_639)
                    ;
                    Throw_MoreThanOnceDefined(this,&local_610,&local_638);
                    std::__cxx11::string::~string((string *)&local_638);
                    std::allocator<char>::~allocator((allocator<char> *)&local_639);
                    std::__cxx11::string::~string((string *)&local_610);
                    std::allocator<char>::~allocator((allocator<char> *)&local_611);
                  }
                  fVar7 = XML_ReadNode_GetVal_AsFloat(this);
                  this_00->TextureCoordinate[0].y = fVar7;
                  local_110 = CONCAT13(1,(undefined3)local_110);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_660,"v2",&local_661);
                  bVar1 = XML_CheckNode_NameEqual(this,&local_660);
                  std::__cxx11::string::~string((string *)&local_660);
                  std::allocator<char>::~allocator((allocator<char> *)&local_661);
                  if (bVar1) {
                    if ((local_10c & 1) != 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)&local_688,"v2",&local_689);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&local_6b0,"Only one component can be defined.",
                                 &local_6b1);
                      Throw_MoreThanOnceDefined(this,&local_688,&local_6b0);
                      std::__cxx11::string::~string((string *)&local_6b0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
                      std::__cxx11::string::~string((string *)&local_688);
                      std::allocator<char>::~allocator((allocator<char> *)&local_689);
                    }
                    fVar7 = XML_ReadNode_GetVal_AsFloat(this);
                    this_00->TextureCoordinate[1].y = fVar7;
                    local_10c = CONCAT11(local_10c._1_1_,1);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_6d8,"v3",&local_6d9);
                    bVar1 = XML_CheckNode_NameEqual(this,&local_6d8);
                    std::__cxx11::string::~string((string *)&local_6d8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
                    if (bVar1) {
                      if ((local_10c & 0x100) != 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_700,"v3",&local_701);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_728,"Only one component can be defined.",
                                   &local_729);
                        Throw_MoreThanOnceDefined(this,&local_700,&local_728);
                        std::__cxx11::string::~string((string *)&local_728);
                        std::allocator<char>::~allocator((allocator<char> *)&local_729);
                        std::__cxx11::string::~string((string *)&local_700);
                        std::allocator<char>::~allocator((allocator<char> *)&local_701);
                      }
                      fVar7 = XML_ReadNode_GetVal_AsFloat(this);
                      this_00->TextureCoordinate[2].y = fVar7;
                      local_10c = CONCAT11(1,(undefined1)local_10c);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)&local_750,"map",&local_751);
                      XML_CheckNode_SkipUnsupported(this,&local_750);
                      std::__cxx11::string::~string((string *)&local_750);
                      std::allocator<char>::~allocator((allocator<char> *)&local_751);
                    }
                  }
                }
              }
            }
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_778,"map",&local_779);
      bVar1 = XML_CheckNode_NameEqual(this,&local_778);
      std::__cxx11::string::~string((string *)&local_778);
      std::allocator<char>::~allocator((allocator<char> *)&local_779);
    } while (!bVar1);
    local_45a = 1;
LAB_005812fc:
    if ((local_45a & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_7a0,"map",&local_7a1);
      Throw_CloseNotFound(this,&local_7a0);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
    }
  }
  else {
    local_111 = 0;
    do {
      do {
        while( true ) {
          uVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar4 & 1) == 0) goto LAB_005803cd;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_138,"utex1",&local_139);
          bVar1 = XML_CheckNode_NameEqual(this,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::allocator<char>::~allocator((allocator<char> *)&local_139);
          if (bVar1) {
            if ((local_110 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_160,"utex1",&local_161);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_188,"Only one component can be defined.",&local_189);
              Throw_MoreThanOnceDefined(this,&local_160,&local_188);
              std::__cxx11::string::~string((string *)&local_188);
              std::allocator<char>::~allocator((allocator<char> *)&local_189);
              std::__cxx11::string::~string((string *)&local_160);
              std::allocator<char>::~allocator((allocator<char> *)&local_161);
            }
            fVar7 = XML_ReadNode_GetVal_AsFloat(this);
            this_00->TextureCoordinate[0].x = fVar7;
            local_110 = CONCAT31(local_110._1_3_,1);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1b0,"utex2",&local_1b1);
            bVar1 = XML_CheckNode_NameEqual(this,&local_1b0);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
            if (bVar1) {
              if ((local_110 & 0x100) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_1d8,"utex2",&local_1d9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_200,"Only one component can be defined.",&local_201);
                Throw_MoreThanOnceDefined(this,&local_1d8,&local_200);
                std::__cxx11::string::~string((string *)&local_200);
                std::allocator<char>::~allocator((allocator<char> *)&local_201);
                std::__cxx11::string::~string((string *)&local_1d8);
                std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
              }
              fVar7 = XML_ReadNode_GetVal_AsFloat(this);
              this_00->TextureCoordinate[1].x = fVar7;
              local_110._0_2_ = CONCAT11(1,(undefined1)local_110);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_228,"utex3",&local_229);
              bVar1 = XML_CheckNode_NameEqual(this,&local_228);
              std::__cxx11::string::~string((string *)&local_228);
              std::allocator<char>::~allocator((allocator<char> *)&local_229);
              if (bVar1) {
                if ((local_110 & 0x10000) != 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_250,"utex3",&local_251);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_278,"Only one component can be defined.",&local_279);
                  Throw_MoreThanOnceDefined(this,&local_250,&local_278);
                  std::__cxx11::string::~string((string *)&local_278);
                  std::allocator<char>::~allocator((allocator<char> *)&local_279);
                  std::__cxx11::string::~string((string *)&local_250);
                  std::allocator<char>::~allocator((allocator<char> *)&local_251);
                }
                fVar7 = XML_ReadNode_GetVal_AsFloat(this);
                this_00->TextureCoordinate[2].x = fVar7;
                local_110._0_3_ = CONCAT12(1,(undefined2)local_110);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_2a0,"vtex1",&local_2a1);
                bVar1 = XML_CheckNode_NameEqual(this,&local_2a0);
                std::__cxx11::string::~string((string *)&local_2a0);
                std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
                if (bVar1) {
                  if ((local_110 & 0x1000000) != 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_2c8,"vtex1",&local_2c9);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_2f0,"Only one component can be defined.",&local_2f1)
                    ;
                    Throw_MoreThanOnceDefined(this,&local_2c8,&local_2f0);
                    std::__cxx11::string::~string((string *)&local_2f0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
                    std::__cxx11::string::~string((string *)&local_2c8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
                  }
                  fVar7 = XML_ReadNode_GetVal_AsFloat(this);
                  this_00->TextureCoordinate[0].y = fVar7;
                  local_110 = CONCAT13(1,(undefined3)local_110);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_318,"vtex2",&local_319);
                  bVar1 = XML_CheckNode_NameEqual(this,&local_318);
                  std::__cxx11::string::~string((string *)&local_318);
                  std::allocator<char>::~allocator((allocator<char> *)&local_319);
                  if (bVar1) {
                    if ((local_10c & 1) != 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)&local_340,"vtex2",&local_341);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&local_368,"Only one component can be defined.",
                                 &local_369);
                      Throw_MoreThanOnceDefined(this,&local_340,&local_368);
                      std::__cxx11::string::~string((string *)&local_368);
                      std::allocator<char>::~allocator((allocator<char> *)&local_369);
                      std::__cxx11::string::~string((string *)&local_340);
                      std::allocator<char>::~allocator((allocator<char> *)&local_341);
                    }
                    fVar7 = XML_ReadNode_GetVal_AsFloat(this);
                    this_00->TextureCoordinate[1].y = fVar7;
                    local_10c = CONCAT11(local_10c._1_1_,1);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_390,"vtex3",&local_391);
                    bVar1 = XML_CheckNode_NameEqual(this,&local_390);
                    std::__cxx11::string::~string((string *)&local_390);
                    std::allocator<char>::~allocator((allocator<char> *)&local_391);
                    if (bVar1) {
                      if ((local_10c & 0x100) != 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_3b8,"vtex3",&local_3b9);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_3e0,"Only one component can be defined.",
                                   &local_3e1);
                        Throw_MoreThanOnceDefined(this,&local_3b8,&local_3e0);
                        std::__cxx11::string::~string((string *)&local_3e0);
                        std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
                        std::__cxx11::string::~string((string *)&local_3b8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
                      }
                      fVar7 = XML_ReadNode_GetVal_AsFloat(this);
                      this_00->TextureCoordinate[2].y = fVar7;
                      local_10c = CONCAT11(1,(undefined1)local_10c);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)&local_408,"texmap",&local_409);
                      XML_CheckNode_SkipUnsupported(this,&local_408);
                      std::__cxx11::string::~string((string *)&local_408);
                      std::allocator<char>::~allocator((allocator<char> *)&local_409);
                    }
                  }
                }
              }
            }
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_430,"texmap",&local_431);
      bVar1 = XML_CheckNode_NameEqual(this,&local_430);
      std::__cxx11::string::~string((string *)&local_430);
      std::allocator<char>::~allocator((allocator<char> *)&local_431);
    } while (!bVar1);
    local_111 = 1;
LAB_005803cd:
    if ((local_111 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_458,"texmap",&local_459);
      Throw_CloseNotFound(this,(string *)local_458);
      std::__cxx11::string::~string((string *)local_458);
      std::allocator<char>::~allocator((allocator<char> *)&local_459);
    }
  }
  ParseHelper_Node_Exit(this);
  if (((((local_110 & 1) != 0) && ((local_110 & 0x100) != 0)) &&
      (((local_110 & 0x10000) != 0 && (((local_110 & 0x1000000) != 0 && ((local_10c & 1) != 0))))))
     && ((local_10c & 0x100) != 0)) {
    std::__cxx11::string::operator=
              ((string *)&this_00->TextureID_R,(string *)(gtexid.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)&this_00->TextureID_G,(string *)(btexid.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)&this_00->TextureID_B,(string *)(atexid.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&this_00->TextureID_A,(string *)&idx_end);
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_List,(value_type *)&als);
    std::__cxx11::string::~string((string *)&idx_end);
    std::__cxx11::string::~string((string *)(atexid.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(btexid.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(gtexid.field_2._M_local_buf + 8));
    return;
  }
  pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7c8,"Not all texture coordinates are defined.",&local_7c9);
  DeadlyImportError::DeadlyImportError(pDVar6,&local_7c8);
  __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AMFImporter::ParseNode_TexMap(const bool pUseOldName) {
    std::string rtexid, gtexid, btexid, atexid;

	// Read attributes for node <color>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("rtexid", rtexid, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("gtexid", gtexid, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("btexid", btexid, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("atexid", atexid, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create new texture coordinates object.
    CAMFImporter_NodeElement *ne = new CAMFImporter_NodeElement_TexMap(mNodeElement_Cur);

	CAMFImporter_NodeElement_TexMap& als = *((CAMFImporter_NodeElement_TexMap*)ne);// alias for convenience
	// check data
	if(rtexid.empty() && gtexid.empty() && btexid.empty()) throw DeadlyImportError("ParseNode_TexMap. At least one texture ID must be defined.");
	// Check for children nodes
	XML_CheckNode_MustHaveChildren();
	// read children nodes
	bool read_flag[6] = { false, false, false, false, false, false };

	ParseHelper_Node_Enter(ne);
	if(!pUseOldName)
	{
		MACRO_NODECHECK_LOOPBEGIN("texmap");
			MACRO_NODECHECK_READCOMP_F("utex1", read_flag[0], als.TextureCoordinate[0].x);
			MACRO_NODECHECK_READCOMP_F("utex2", read_flag[1], als.TextureCoordinate[1].x);
			MACRO_NODECHECK_READCOMP_F("utex3", read_flag[2], als.TextureCoordinate[2].x);
			MACRO_NODECHECK_READCOMP_F("vtex1", read_flag[3], als.TextureCoordinate[0].y);
			MACRO_NODECHECK_READCOMP_F("vtex2", read_flag[4], als.TextureCoordinate[1].y);
			MACRO_NODECHECK_READCOMP_F("vtex3", read_flag[5], als.TextureCoordinate[2].y);
		MACRO_NODECHECK_LOOPEND("texmap");
	}
	else
	{
		MACRO_NODECHECK_LOOPBEGIN("map");
			MACRO_NODECHECK_READCOMP_F("u1", read_flag[0], als.TextureCoordinate[0].x);
			MACRO_NODECHECK_READCOMP_F("u2", read_flag[1], als.TextureCoordinate[1].x);
			MACRO_NODECHECK_READCOMP_F("u3", read_flag[2], als.TextureCoordinate[2].x);
			MACRO_NODECHECK_READCOMP_F("v1", read_flag[3], als.TextureCoordinate[0].y);
			MACRO_NODECHECK_READCOMP_F("v2", read_flag[4], als.TextureCoordinate[1].y);
			MACRO_NODECHECK_READCOMP_F("v3", read_flag[5], als.TextureCoordinate[2].y);
		MACRO_NODECHECK_LOOPEND("map");
	}// if(!pUseOldName) else

	ParseHelper_Node_Exit();

	// check that all components was defined
	if(!(read_flag[0] && read_flag[1] && read_flag[2] && read_flag[3] && read_flag[4] && read_flag[5]))
		throw DeadlyImportError("Not all texture coordinates are defined.");

	// copy attributes data
	als.TextureID_R = rtexid;
	als.TextureID_G = gtexid;
	als.TextureID_B = btexid;
	als.TextureID_A = atexid;

	mNodeElement_List.push_back(ne);// add to node element list because its a new object in graph.
}